

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halftest.cpp
# Opt level: O1

void printall(void)

{
  uint16_t uVar1;
  int i;
  ulong uVar2;
  int iVar3;
  double __y;
  double dVar4;
  
  uVar2 = 0;
  do {
    printf("0x%x -> %g 0x%x\n",(double)(float)(&Ptex::v2_4::PtexHalf::h2fTable)[uVar2],
           uVar2 & 0xffffffff,(ulong)(uint)(&Ptex::v2_4::PtexHalf::h2fTable)[uVar2]);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x10000);
  __y = -10.0;
  iVar3 = 0x14;
  do {
    dVar4 = pow(10.0,__y);
    uVar1 = Ptex::v2_4::PtexHalf::fromFloat((float)dVar4);
    printf("%g -> 0x%x ->%g\n",dVar4,
           SUB84((double)(float)(&Ptex::v2_4::PtexHalf::h2fTable)[uVar1],0));
    __y = __y + 1.0;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return;
}

Assistant:

void printall()
{
    for (int i = 0; i < 65536; i++) {
        float f = h2f(i);
        printf("0x%x -> %g 0x%x\n", i, f, floatToBits(f));
    }
    for (int e = -10; e < 10; e++) {
        double f = pow(10.0, e);
        int i = f2h(f);
        printf("%g -> 0x%x ->%g\n", f, i, h2f(i));
    }
}